

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<QDBusPlatformMenuItem_*>::reallocateAndGrow
          (QArrayDataPointer<QDBusPlatformMenuItem_*> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QDBusPlatformMenuItem_*> *old)

{
  Data *pDVar1;
  long lVar2;
  QDBusPlatformMenuItem **ppQVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<QDBusPlatformMenuItem_*> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QDBusPlatformMenuItem_*> *)0x0 && where == GrowsAtEnd) &&
       (pDVar1 = this->d, pDVar1 != (Data *)0x0)) && (0 < n)) &&
     ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    lVar2 = (pDVar1->super_QArrayData).alloc;
    qVar4 = freeSpaceAtEnd(this);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QtPrivate::QPodArrayOps<QDBusPlatformMenuItem_*>::reallocate
                ((QPodArrayOps<QDBusPlatformMenuItem_*> *)this,(n + lVar2) - qVar4,Grow);
      return;
    }
  }
  else {
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (QDBusPlatformMenuItem **)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_38,this,n,where);
    if (this->size != 0) {
      QtPrivate::QPodArrayOps<QDBusPlatformMenuItem_*>::copyAppend
                ((QPodArrayOps<QDBusPlatformMenuItem_*> *)&local_38,this->ptr,
                 this->ptr + this->size + (n >> 0x3f & n));
    }
    pDVar1 = this->d;
    ppQVar3 = this->ptr;
    this->d = local_38.d;
    this->ptr = local_38.ptr;
    qVar4 = this->size;
    this->size = local_38.size;
    local_38.d = pDVar1;
    local_38.ptr = ppQVar3;
    local_38.size = qVar4;
    if (old != (QArrayDataPointer<QDBusPlatformMenuItem_*> *)0x0) {
      local_38.d = old->d;
      local_38.ptr = old->ptr;
      old->d = pDVar1;
      old->ptr = ppQVar3;
      local_38.size = old->size;
      old->size = qVar4;
    }
    ~QArrayDataPointer(&local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }